

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O2

unique_ptr<S2Shape,_std::default_delete<S2Shape>_> __thiscall
s2shapeutil::VectorShapeFactory::operator[](VectorShapeFactory *this,int shape_id)

{
  long lVar1;
  int in_EDX;
  undefined4 in_register_00000034;
  
  lVar1 = **(long **)(CONCAT44(in_register_00000034,shape_id) + 8);
  (this->super_ShapeFactory)._vptr_ShapeFactory = *(_func_int ***)(lVar1 + (long)in_EDX * 8);
  *(undefined8 *)(lVar1 + (long)in_EDX * 8) = 0;
  return (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)
         (__uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true>)this;
}

Assistant:

unique_ptr<S2Shape> VectorShapeFactory::operator[](int shape_id) const {
  return std::move((*shared_shapes_)[shape_id]);
}